

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void simd::ConvertToRgb(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                       uint32_t startYOut,uint32_t width,uint32_t height,SIMDType simdType)

{
  uint32_t rowSizeOut;
  SIMDType simdType_00;
  uint32_t uVar1;
  uint uVar2;
  
  do {
    do {
      simdType_00 = simdType;
      simdType = sse_function;
    } while (simdType_00 == avx_function);
    if (simdType_00 == cpu_function) break;
    uVar1 = getSimdSize(simdType_00);
    uVar2 = uVar1;
    if (simdType_00 == neon_function) {
      uVar2 = 8;
    }
    if (uVar2 <= width) {
      Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
                (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
      Image_Function::VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>(out);
      if (in->_colorCount == '\x03') {
        Image_Function::Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
        return;
      }
      if (simdType_00 != sse_function) {
        return;
      }
      rowSizeOut = out->_rowSize;
      sse::ConvertToRgb(out->_data + (ulong)(startXOut * 3) + (ulong)(startYOut * rowSizeOut),
                        out->_data + (ulong)(startXOut * 3) + (ulong)(startYOut * rowSizeOut) +
                        height * rowSizeOut,
                        in->_data + (ulong)startXIn + (ulong)(startYIn * in->_rowSize),rowSizeOut,
                        in->_rowSize,'\x03',width / uVar1,uVar1 * (width / uVar1),width % uVar1);
      return;
    }
  } while (simdType_00 == avx_function);
  Image_Function::ConvertToRgb(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  return;
}

Assistant:

void ConvertToRgb( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                       uint32_t width, uint32_t height, SIMDType simdType )
    {
        uint32_t simdSize = getSimdSize( simdType );
        if( simdType == neon_function ) // for neon, because the algorithm used work with packet of 64 bit
            simdSize = 8u;
        
        const uint8_t colorCount = RGB;

        if( (simdType == cpu_function) || (simdType == avx_function) || (width < simdSize) ) {
            AVX_CODE( ConvertToRgb( in, startXIn, startYIn, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::ConvertToRgb( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyRGBImage     ( out );

        if( in.colorCount() == RGB ) {
            Image_Function::Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        SSSE3_CODE( sse::ConvertToRgb( outY, outYEnd, inY, rowSizeOut, rowSizeIn, colorCount, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::ConvertToRgb( outY, outYEnd, inY, rowSizeOut, rowSizeIn, colorCount, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }